

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O0

void __thiscall cmDependsC::Scan(cmDependsC *this,istream *is,string *directory,string *fullName)

{
  bool bVar1;
  byte local_142;
  _Self local_110;
  _Self local_108;
  string local_100;
  string local_e0;
  string local_c0;
  undefined1 local_a0 [8];
  UnscannedEntry entry;
  undefined1 local_50 [8];
  string line;
  cmIncludeLines *newCacheEntry;
  string *fullName_local;
  string *directory_local;
  istream *is_local;
  cmDependsC *this_local;
  
  line.field_2._8_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines>_>_>
       ::operator[](&this->FileCache,fullName);
  ((mapped_type *)line.field_2._8_8_)->Used = true;
  std::__cxx11::string::string((string *)local_50);
  while (bVar1 = cmsys::SystemTools::GetLineFromStream
                           (is,(string *)local_50,(bool *)0x0,0xffffffffffffffff), bVar1) {
    bVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::empty(&this->TransformRules);
    if (!bVar1) {
      TransformLine(this,(string *)local_50);
    }
    bVar1 = cmsys::RegularExpression::find(&this->IncludeRegexLine,(string *)local_50);
    if (bVar1) {
      UnscannedEntry::UnscannedEntry((UnscannedEntry *)local_a0);
      cmsys::RegularExpression::match_abi_cxx11_(&local_c0,&this->IncludeRegexLine,2);
      std::__cxx11::string::operator=((string *)local_a0,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      cmsys::SystemTools::ConvertToUnixSlashes((string *)local_a0);
      cmsys::RegularExpression::match_abi_cxx11_(&local_e0,&this->IncludeRegexLine,3);
      bVar1 = std::operator==(&local_e0,"\"");
      local_142 = 0;
      if (bVar1) {
        bVar1 = cmsys::SystemTools::FileIsFullPath((string *)local_a0);
        local_142 = bVar1 ^ 0xff;
      }
      std::__cxx11::string::~string((string *)&local_e0);
      if ((local_142 & 1) != 0) {
        cmsys::SystemTools::CollapseFullPath(&local_100,(string *)local_a0,directory);
        std::__cxx11::string::operator=
                  ((string *)(entry.FileName.field_2._M_local_buf + 8),(string *)&local_100);
        std::__cxx11::string::~string((string *)&local_100);
      }
      bVar1 = cmsys::RegularExpression::find(&this->IncludeRegexScan,(string *)local_a0);
      if (bVar1) {
        std::vector<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
        push_back((vector<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_> *
                  )line.field_2._8_8_,(value_type *)local_a0);
        local_108._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(&this->Encountered,(key_type *)local_a0);
        local_110._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&this->Encountered);
        bVar1 = std::operator==(&local_108,&local_110);
        if (bVar1) {
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&this->Encountered,(value_type *)local_a0);
          std::
          queue<cmDependsC::UnscannedEntry,_std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
          ::push(&this->Unscanned,(value_type *)local_a0);
        }
      }
      UnscannedEntry::~UnscannedEntry((UnscannedEntry *)local_a0);
    }
  }
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void cmDependsC::Scan(std::istream& is, const std::string& directory,
                      const std::string& fullName)
{
  cmIncludeLines& newCacheEntry = this->FileCache[fullName];
  newCacheEntry.Used = true;

  // Read one line at a time.
  std::string line;
  while (cmSystemTools::GetLineFromStream(is, line)) {
    // Transform the line content first.
    if (!this->TransformRules.empty()) {
      this->TransformLine(line);
    }

    // Match include directives.
    if (this->IncludeRegexLine.find(line)) {
      // Get the file being included.
      UnscannedEntry entry;
      entry.FileName = this->IncludeRegexLine.match(2);
      cmSystemTools::ConvertToUnixSlashes(entry.FileName);
      if (this->IncludeRegexLine.match(3) == "\"" &&
          !cmSystemTools::FileIsFullPath(entry.FileName)) {
        // This was a double-quoted include with a relative path.  We
        // must check for the file in the directory containing the
        // file we are scanning.
        entry.QuotedLocation =
          cmSystemTools::CollapseFullPath(entry.FileName, directory);
      }

      // Queue the file if it has not yet been encountered and it
      // matches the regular expression for recursive scanning.  Note
      // that this check does not account for the possibility of two
      // headers with the same name in different directories when one
      // is included by double-quotes and the other by angle brackets.
      // It also does not work properly if two header files with the same
      // name exist in different directories, and both are included from a
      // file their own directory by simply using "filename.h" (#12619)
      // This kind of problem will be fixed when a more
      // preprocessor-like implementation of this scanner is created.
      if (this->IncludeRegexScan.find(entry.FileName)) {
        newCacheEntry.UnscannedEntries.push_back(entry);
        if (this->Encountered.find(entry.FileName) ==
            this->Encountered.end()) {
          this->Encountered.insert(entry.FileName);
          this->Unscanned.push(entry);
        }
      }
    }
  }
}